

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O0

void __thiscall
ICM::Compiler::IdentifierAnalysis::setIdentifier(IdentifierAnalysis *this,Element *element)

{
  bool bVar1;
  IdentSpaceIndex sid;
  IdentTableUnit *pIVar2;
  IdentTableUnit *itu;
  IdentIndex ii;
  IdentKey *key;
  Element *element_local;
  IdentifierAnalysis *this_local;
  
  ii = (IdentIndex)ASTBase::Element::getIndex(element);
  sid = getCurrentIdentSpaceIndex();
  IdentIndex::IdentIndex((IdentIndex *)&itu,sid,0);
  bVar1 = isIdentDefined(this,(IdentKey *)ii,(IdentIndex *)&itu);
  if (bVar1) {
    pIVar2 = getFromIdentTable((IdentIndex *)&itu);
    setIdent(this,element,pIVar2->type,(IdentIndex *)&itu);
  }
  else {
    itu._4_4_ = insertFromIdentTable((IdentSpaceIndex)itu,(IdentKey *)ii,I_DyVarb);
    setIdent(this,element,I_DyVarb,(IdentIndex *)&itu);
  }
  return;
}

Assistant:

void setIdentifier(Element &element) {
				const IdentKey &key = element.getIndex();
				IdentIndex ii(getCurrentIdentSpaceIndex());
				if (isIdentDefined(key, ii)) {
					IdentTableUnit &itu = getFromIdentTable(ii);
					setIdent(element, itu.type, ii);
				}
				else {
					ii.ident_index = insertFromIdentTable(ii.space_index, key, I_DyVarb);
					setIdent(element, I_DyVarb, ii);
				}
			}